

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t decode_number(archive_read *a,decode_table *table,uint8_t *p,uint16_t *num)

{
  wchar_t *pwVar1;
  rar5 *rar;
  wchar_t wVar2;
  uint uVar3;
  uint16_t *puVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ushort local_1a;
  
  rar = (rar5 *)a->format->data;
  wVar2 = read_bits_16(a,rar,p,&local_1a);
  if (wVar2 == L'\0') {
    uVar3 = local_1a & 0xfffffffe;
    uVar5 = (ulong)table->quick_bits;
    if ((int)uVar3 < table->decode_len[uVar5]) {
      uVar3 = uVar3 >> (0x10U - (char)table->quick_bits & 0x3f);
      iVar6 = (int)(rar->bits).bit_addr + (uint)table->quick_len[uVar3];
      pwVar1 = &(rar->bits).in_addr;
      *pwVar1 = *pwVar1 + (iVar6 >> 3);
      (rar->bits).bit_addr = (byte)iVar6 & 7;
      puVar4 = table->quick_num + uVar3;
    }
    else {
      do {
        uVar7 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar7;
        if (0xe < (int)uVar7) {
          uVar7 = 0xf;
          break;
        }
      } while (table->decode_len[(int)uVar7] <= (int)uVar3);
      iVar6 = (int)(rar->bits).bit_addr + uVar7;
      pwVar1 = &(rar->bits).in_addr;
      *pwVar1 = *pwVar1 + (iVar6 >> 3);
      (rar->bits).bit_addr = (byte)iVar6 & 7;
      uVar3 = ((int)(uVar3 - table->decode_len[(long)(int)uVar7 + -1]) >>
              (0x10U - (char)uVar7 & 0x1f)) + table->decode_pos[(int)uVar7];
      uVar5 = 0;
      if (uVar3 < table->size) {
        uVar5 = (ulong)uVar3;
      }
      puVar4 = table->decode_num + uVar5;
    }
    *num = *puVar4;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

static int decode_number(struct archive_read* a, struct decode_table* table,
    const uint8_t* p, uint16_t* num)
{
	int i, bits, dist, ret;
	uint16_t bitfield;
	uint32_t pos;
	struct rar5* rar = get_context(a);

	if(ARCHIVE_OK != (ret = read_bits_16(a, rar, p, &bitfield))) {
		return ret;
	}

	bitfield &= 0xfffe;

	if(bitfield < table->decode_len[table->quick_bits]) {
		int code = bitfield >> (16 - table->quick_bits);
		skip_bits(rar, table->quick_len[code]);
		*num = table->quick_num[code];
		return ARCHIVE_OK;
	}

	bits = 15;

	for(i = table->quick_bits + 1; i < 15; i++) {
		if(bitfield < table->decode_len[i]) {
			bits = i;
			break;
		}
	}

	skip_bits(rar, bits);

	dist = bitfield - table->decode_len[bits - 1];
	dist >>= (16 - bits);
	pos = table->decode_pos[bits] + dist;

	if(pos >= table->size)
		pos = 0;

	*num = table->decode_num[pos];
	return ARCHIVE_OK;
}